

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void __thiscall capnp::_::StructBuilder::copyContentFrom(StructBuilder *this,StructReader other)

{
  ushort uVar1;
  uint uVar2;
  word *pwVar3;
  uint uVar4;
  byte bVar5;
  word *srcTarget;
  long lVar6;
  ulong uVar7;
  short sVar8;
  long lVar9;
  bool _kjCondition;
  ulong local_48;
  CapTableReader *local_40;
  Fault f;
  
  uVar2 = this->dataSize;
  uVar4 = other.dataSize;
  if (uVar2 < other.dataSize) {
    uVar4 = uVar2;
  }
  if ((ushort)*(uint *)&this->pointerCount < other.pointerCount) {
    other._36_4_ = *(uint *)&this->pointerCount;
  }
  sVar8 = (short)other._36_4_;
  if (((uVar4 == 0) || (other.data != this->data)) &&
     ((sVar8 == 0 || (other.pointers != this->pointers)))) {
    if (other.dataSize < uVar2) {
      if (uVar2 == 1) {
        *(byte *)this->data = *this->data & 0xfe;
      }
      else if (7 < uVar2 - uVar4) {
        memset((void *)((ulong)(uVar4 >> 3) + (long)this->data),0,(ulong)(uVar2 - uVar4 >> 3));
      }
    }
    if (uVar4 == 1) {
      if (other.dataSize == 0) {
        bVar5 = 0;
      }
      else {
        bVar5 = *other.data & 1;
      }
      *(byte *)this->data = *this->data & 0xfe | bVar5;
    }
    else if (7 < uVar4) {
      memcpy(this->data,other.data,(ulong)(uVar4 >> 3));
    }
    uVar1 = this->pointerCount;
    if (uVar1 != 0) {
      lVar9 = 0;
      do {
        WireHelpers::zeroObject
                  (this->segment,this->capTable,
                   (WirePointer *)((long)&(this->pointers->offsetAndKind).value + lVar9));
        lVar9 = lVar9 + 8;
      } while ((ulong)uVar1 * 8 != lVar9);
    }
    if (this->pointerCount != 0) {
      memset(this->pointers,0,(ulong)this->pointerCount << 3);
    }
    if (sVar8 != 0) {
      local_40 = other.capTable;
      local_48 = (ulong)(uint)other.nestingLimit;
      uVar7 = 0;
      lVar9 = -(long)other.pointers;
      do {
        lVar6 = (long)(*(int *)((long)&((other.pointers)->offsetAndKind).value + uVar7) >> 2);
        if (other.segment == (SegmentReader *)0x0) {
          srcTarget = (word *)((long)&other.pointers[lVar6 + 1].offsetAndKind.value + uVar7);
        }
        else {
          pwVar3 = ((other.segment)->ptr).ptr;
          srcTarget = pwVar3 + ((other.segment)->ptr).size_;
          if (((long)&pwVar3[-1].content + lVar9 >> 3 <= lVar6) &&
             (lVar6 <= (long)&srcTarget[-1].content + lVar9 >> 3)) {
            srcTarget = (word *)((long)&other.pointers[lVar6 + 1].offsetAndKind.value + uVar7);
          }
        }
        WireHelpers::copyPointer
                  (this->segment,this->capTable,
                   (WirePointer *)((long)&(this->pointers->offsetAndKind).value + uVar7),
                   other.segment,local_40,
                   (WirePointer *)((long)&((other.pointers)->offsetAndKind).value + uVar7),srcTarget
                   ,(int)local_48,(BuilderArena *)0x0,false);
        uVar7 = uVar7 + 8;
        lVar9 = lVar9 + -8;
      } while ((other._36_4_ & 0xffff) << 3 != uVar7);
    }
    return;
  }
  if ((uVar4 == 0) || (other.data == this->data)) {
    if (sVar8 == 0) {
      return;
    }
    _kjCondition = other.pointers == this->pointers;
    if (_kjCondition) {
      return;
    }
  }
  else {
    _kjCondition = false;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xb62,FAILED,
             "(sharedDataSize == ZERO * BITS || other.data == data) && (sharedPointerCount == ZERO * POINTERS || other.pointers == pointers)"
             ,"_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void StructBuilder::copyContentFrom(StructReader other) {
  // Determine the amount of data the builders have in common.
  auto sharedDataSize = kj::min(dataSize, other.dataSize);
  auto sharedPointerCount = kj::min(pointerCount, other.pointerCount);

  if ((sharedDataSize > ZERO * BITS && other.data == data) ||
      (sharedPointerCount > ZERO * POINTERS && other.pointers == pointers)) {
    // At least one of the section pointers is pointing to ourself. Verify that the other is two
    // (but ignore empty sections).
    KJ_ASSERT((sharedDataSize == ZERO * BITS || other.data == data) &&
              (sharedPointerCount == ZERO * POINTERS || other.pointers == pointers));
    // So `other` appears to be a reader for this same struct. No coping is needed.
    return;
  }

  if (dataSize > sharedDataSize) {
    // Since the target is larger than the source, make sure to zero out the extra bits that the
    // source doesn't have.
    if (dataSize == ONE * BITS) {
      setDataField<bool>(ZERO * ELEMENTS, false);
    } else {
      byte* unshared = reinterpret_cast<byte*>(data) + sharedDataSize / BITS_PER_BYTE;
      WireHelpers::zeroMemory(unshared,
          subtractChecked(dataSize, sharedDataSize, []() {}) / BITS_PER_BYTE);
    }
  }

  // Copy over the shared part.
  if (sharedDataSize == ONE * BITS) {
    setDataField<bool>(ZERO * ELEMENTS, other.getDataField<bool>(ZERO * ELEMENTS));
  } else {
    WireHelpers::copyMemory(reinterpret_cast<byte*>(data),
                            reinterpret_cast<const byte*>(other.data),
                            sharedDataSize / BITS_PER_BYTE);
  }

  // Zero out all pointers in the target.
  for (auto i: kj::zeroTo(pointerCount)) {
    WireHelpers::zeroObject(segment, capTable, pointers + i);
  }
  WireHelpers::zeroMemory(pointers, pointerCount);

  // Copy the pointers.
  for (auto i: kj::zeroTo(sharedPointerCount)) {
    WireHelpers::copyPointer(segment, capTable, pointers + i,
        other.segment, other.capTable, other.pointers + i, other.nestingLimit);
  }
}